

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::AuthenticatedStream>
kj::anon_unknown_0::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs,bool authenticated)

{
  SourceLocation location;
  bool bVar1;
  SocketAddress *pSVar2;
  undefined7 in_register_00000081;
  byte in_R9B;
  SourceLocation local_118;
  NetworkFilter *local_100;
  SocketAddress *local_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  byte local_e0;
  Type local_d8;
  anon_class_24_3_40938c43 local_b0;
  undefined1 local_98 [32];
  Fault f;
  EventLoop *local_70;
  DebugExpression<unsigned_long> local_68;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  bool authenticated_local;
  NetworkFilter *filter_local;
  LowLevelAsyncIoProvider *lowLevel_local;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs_local;
  
  addrs_local.ptr = (SocketAddress *)CONCAT71(in_register_00000081,authenticated);
  lowLevel_local = (LowLevelAsyncIoProvider *)addrs.size_;
  pSVar2 = addrs.ptr;
  _kjCondition._39_1_ = in_R9B & 1;
  addrs_local.size_ = (size_t)lowLevel;
  local_70 = (EventLoop *)
             ArrayPtr<kj::(anonymous_namespace)::SocketAddress>::size
                       ((ArrayPtr<kj::(anonymous_namespace)::SocketAddress> *)&lowLevel_local);
  local_68 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long *)&stack0xffffffffffffff90);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_60,&stack0xffffffffffffff98,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)(local_98 + 0x18),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x665,FAILED,"addrs.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_60);
    kj::_::Debug::Fault::fatal((Fault *)(local_98 + 0x18));
  }
  local_b0.addrs = (ArrayPtr<kj::(anonymous_namespace)::SocketAddress> *)&lowLevel_local;
  local_b0.filter = (NetworkFilter *)pSVar2;
  local_b0.lowLevel = (LowLevelAsyncIoProvider *)filter;
  evalNow<kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda()_1_>
            ((kj *)local_98,&local_b0);
  local_d8.addrs.ptr = (SocketAddress *)lowLevel_local;
  local_d8.addrs.size_ = (size_t)addrs_local.ptr;
  local_d8.authenticated = (bool)(_kjCondition._39_1_ & 1);
  local_f0 = lowLevel_local._0_4_;
  uStack_ec = lowLevel_local._4_4_;
  uStack_e8 = addrs_local.ptr._0_4_;
  uStack_e4 = addrs_local.ptr._4_4_;
  local_e0 = _kjCondition._39_1_ & 1;
  local_100 = filter;
  local_f8 = pSVar2;
  local_d8.lowLevel = (LowLevelAsyncIoProvider *)filter;
  local_d8.filter = (NetworkFilter *)pSVar2;
  SourceLocation::SourceLocation
            (&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,"connectImpl",0x667,0xc);
  location.function = local_118.function;
  location.fileName = local_118.fileName;
  location.lineNumber = local_118.lineNumber;
  location.columnNumber = local_118.columnNumber;
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Own<kj::AsyncIoStream,decltype(nullptr)>&&)_1_,kj::(anonymous_namespace)::NetworkAddressImpl::connectImpl(kj::LowLevelAsyncIoProvider&,kj::LowLevelAsyncIoProvider::NetworkFilter&,kj::ArrayPtr<kj::(anonymous_namespace)::SocketAddress>,bool)::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)lowLevel,(Type *)local_98,
             &local_d8,location);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)local_98);
  return (PromiseBase)(PromiseBase)lowLevel;
}

Assistant:

static Promise<AuthenticatedStream> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs,
      bool authenticated) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        auto fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            kj::mv(fd), addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([&lowLevel,&filter,addrs,authenticated](Own<AsyncIoStream>&& stream)
        -> Promise<AuthenticatedStream> {
      // Success, pass along.
      AuthenticatedStream result;
      result.stream = kj::mv(stream);
      if (authenticated) {
        result.peerIdentity = addrs[0].getIdentity(lowLevel, filter, *result.stream);
      }
      return kj::mv(result);
    }, [&lowLevel,&filter,addrs,authenticated](Exception&& exception) mutable
        -> Promise<AuthenticatedStream> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()), authenticated);
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }